

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void print<mpt::metatype*>(void)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  void *this;
  int bsid;
  int bid;
  int mid;
  int sid;
  int id;
  
  iVar3 = mpt::type_properties<mpt::metatype_*>::id(true);
  iVar4 = mpt::type_properties<mpt::span<mpt::metatype_*const>_>::id(true);
  iVar5 = mpt::type_properties<mpt::span<mpt::metatype_*>_>::id(true);
  bVar1 = mpt::basetype((long)iVar3);
  bVar2 = mpt::basetype((long)iVar4);
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
  poVar6 = std::operator<<(poVar6,' ');
  poVar6 = std::operator<<(poVar6,'<');
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)bVar1);
  poVar6 = std::operator<<(poVar6,'>');
  std::operator<<(poVar6,' ');
  poVar6 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
  poVar6 = std::operator<<(poVar6,' ');
  poVar6 = std::operator<<(poVar6,'<');
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(uint)bVar2);
  poVar6 = std::operator<<(poVar6,'>');
  std::operator<<(poVar6,' ');
  this = (void *)std::ostream::operator<<(&std::cout,iVar5);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print()
{
	int id = mpt::type_properties<T>::id(true);
	int sid = mpt::type_properties<mpt::span<const T> >::id(true);
	int mid = mpt::type_properties<mpt::span<T> >::id(true);
	int bid = mpt::basetype(id);
	int bsid = mpt::basetype(sid);
	std::cout << id  << ' ' << '<' << bid  << '>' << ' ';
	std::cout << sid << ' ' << '<' << bsid << '>' << ' ';
	std::cout << mid << std::endl;
}